

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm.cpp
# Opt level: O2

Ref<embree::Image> __thiscall embree::loadPPM(embree *this,FileName *fileName)

{
  undefined1 auVar1 [12];
  int iVar2;
  bool bVar3;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  runtime_error *prVar4;
  ssize_t y_1;
  size_t width_00;
  ssize_t x;
  long lVar5;
  size_t height_00;
  ssize_t y;
  long lVar6;
  int r;
  undefined2 uStack_2c4;
  int height;
  int width;
  int maxColor;
  char cty [2];
  int b;
  int g;
  undefined1 local_2a8 [16];
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  undefined4 uStack_27c;
  Image *local_268;
  string type;
  fstream file;
  
  std::fstream::fstream(&file);
  std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
  std::fstream::open((char *)&file,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  std::istream::read((char *)&file,(long)cty);
  skipSpacesAndComments(&file);
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type.field_2._0_1_ = cty[0];
  type.field_2._1_1_ = cty[1];
  type._M_string_length = 2;
  type.field_2._M_local_buf[2] = '\0';
  std::istream::operator>>((istream *)&file,&width);
  skipSpacesAndComments(&file);
  std::istream::operator>>((istream *)&file,&height);
  skipSpacesAndComments(&file);
  std::istream::operator>>((istream *)&file,&maxColor);
  iVar2 = maxColor;
  if (maxColor < 1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Invalid maxColor value in PPM file");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::ignore();
  this_00 = (ImageT<embree::Col4<unsigned_char>_> *)::operator_new(0x48);
  width_00 = (size_t)width;
  height_00 = (size_t)height;
  std::__cxx11::string::string((string *)local_288,(string *)fileName);
  ImageT<embree::Col4<unsigned_char>_>::ImageT(this_00,width_00,height_00,(string *)local_288);
  *(ImageT<embree::Col4<unsigned_char>_> **)this = this_00;
  (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
  local_2a8 = ZEXT416((uint)(1.0 / (float)iVar2));
  std::__cxx11::string::~string((string *)local_288);
  bVar3 = std::operator==(&type,"P3");
  local_268 = (Image *)this;
  if (bVar3) {
    local_298 = (float)local_2a8._0_4_;
    fStack_294 = (float)local_2a8._0_4_;
    fStack_290 = (float)local_2a8._0_4_;
    fStack_28c = (float)local_2a8._0_4_;
    for (lVar6 = 0; lVar6 < height; lVar6 = lVar6 + 1) {
      for (lVar5 = 0; lVar5 < width; lVar5 = lVar5 + 1) {
        std::istream::operator>>((istream *)&file,&r);
        std::istream::operator>>((istream *)&file,&g);
        std::istream::operator>>((istream *)&file,&b);
        local_288._0_4_ =
             (float)CONCAT13(r._3_1_,CONCAT12(r._2_1_,CONCAT11(r._1_1_,(byte)r))) *
             (float)local_2a8._0_4_;
        local_288._4_4_ = (float)g * local_298;
        fStack_280 = (float)b * fStack_294;
        uStack_27c = 0x3f800000;
        (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])(this_00,lVar5,lVar6,local_288);
      }
    }
  }
  else {
    bVar3 = std::operator==(&type,"P6");
    if ((bVar3) && (maxColor < 0x100)) {
      local_298 = (float)local_2a8._0_4_;
      fStack_294 = (float)local_2a8._0_4_;
      fStack_290 = (float)local_2a8._0_4_;
      fStack_28c = (float)local_2a8._0_4_;
      for (lVar6 = 0; lVar6 < height; lVar6 = lVar6 + 1) {
        for (lVar5 = 0; lVar5 < width; lVar5 = lVar5 + 1) {
          std::istream::read((char *)&file,(long)&r);
          local_288._0_4_ = (float)(byte)r * (float)local_2a8._0_4_;
          local_288._4_4_ = (float)r._1_1_ * local_298;
          fStack_280 = (float)r._2_1_ * fStack_294;
          uStack_27c = 0x3f800000;
          (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])(this_00,lVar5,lVar6,local_288);
        }
      }
    }
    else {
      bVar3 = std::operator==(&type,"P6");
      if ((!bVar3) || (0xffff < maxColor)) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Invalid magic value in PPM file");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_298 = (float)local_2a8._0_4_;
      fStack_294 = (float)local_2a8._0_4_;
      fStack_290 = (float)local_2a8._0_4_;
      fStack_28c = (float)local_2a8._0_4_;
      for (lVar6 = 0; lVar6 < height; lVar6 = lVar6 + 1) {
        for (lVar5 = 0; lVar5 < width; lVar5 = lVar5 + 1) {
          std::istream::read((char *)&file,(long)&r);
          local_288._0_4_ = (float)CONCAT11(r._1_1_,(byte)r) * (float)local_2a8._0_4_;
          auVar1._2_10_ = SUB1610(ZEXT816(0) << 0x40,6);
          auVar1._0_2_ = uStack_2c4;
          local_288._4_4_ = (float)CONCAT11(r._3_1_,r._2_1_) * local_298;
          fStack_280 = (float)auVar1._0_4_ * fStack_294;
          uStack_27c = 0x3f800000;
          (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])(this_00,lVar5,lVar6,local_288);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&type);
  std::fstream::~fstream(&file);
  return (Ref<embree::Image>)local_268;
}

Assistant:

Ref<Image> loadPPM(const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::in | std::fstream::binary);

    /* read file type */
    char cty[2]; file.read(cty,2);
    skipSpacesAndComments(file);
    std::string type(cty,2);

    /* read width, height, and maximum color value */
    int width; file >> width;
    skipSpacesAndComments(file);
    int height; file >> height;
    skipSpacesAndComments(file);
    int maxColor; file >> maxColor;
    if (maxColor <= 0) THROW_RUNTIME_ERROR("Invalid maxColor value in PPM file");
    float rcpMaxColor = 1.0f/float(maxColor);
    file.ignore(); // skip space or return

    /* create image and fill with data */
    Ref<Image> img = new Image4uc(width,height,fileName);

    /* image in text format */
    if (type == "P3")
    {
      int r, g, b;
      for (ssize_t y=0; y<height; y++) {
        for (ssize_t x=0; x<width; x++) {
          file >> r; file >> g; file >> b;
          img->set(x,y,Color4(float(r)*rcpMaxColor,float(g)*rcpMaxColor,float(b)*rcpMaxColor,1.0f));
        }
      }
    }

    /* image in binary format 8 bit */
    else if (type == "P6" && maxColor <= 255)
    {
      unsigned char rgb[3];
      for (ssize_t y=0; y<height; y++) {
        for (ssize_t x=0; x<width; x++) {
          file.read((char*)rgb,sizeof(rgb));
          img->set(x,y,Color4(float(rgb[0])*rcpMaxColor,float(rgb[1])*rcpMaxColor,float(rgb[2])*rcpMaxColor,1.0f));
        }
      }
    }

    /* image in binary format 16 bit */
    else if (type == "P6" && maxColor <= 65535)
    {
      unsigned short rgb[3];
      for (ssize_t y=0; y<height; y++) {
        for (ssize_t x=0; x<width; x++) {
          file.read((char*)rgb,sizeof(rgb));
          img->set(x,y,Color4(float(rgb[0])*rcpMaxColor,float(rgb[1])*rcpMaxColor,float(rgb[2])*rcpMaxColor,1.0f));
        }
      }
    }

    /* invalid magic value */
    else {
      THROW_RUNTIME_ERROR("Invalid magic value in PPM file");
    }
    return img;
  }